

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

ScalarFunction * duckdb::FactorialOperatorFun::GetFunction(void)

{
  LogicalType varargs;
  ScalarFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_fffffffffffffea4;
  undefined4 in_stack_fffffffffffffeac;
  FunctionNullHandling in_stack_fffffffffffffeb8;
  allocator_type local_141;
  code *bind_lambda;
  LogicalType local_120;
  LogicalType local_108;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_f0;
  LogicalType local_d8;
  BaseScalarFunction local_c0;
  
  LogicalType::LogicalType(&local_108,INTEGER);
  __l._M_len = 1;
  __l._M_array = &local_108;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_f0,__l,&local_141);
  LogicalType::LogicalType(&local_120,HUGEINT);
  bind_lambda = ScalarFunction::UnaryFunction<int,duckdb::hugeint_t,duckdb::FactorialOperator>;
  LogicalType::LogicalType(&local_d8,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_d8;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffea4;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffeac;
  ScalarFunction::ScalarFunction
            (in_RDI,(vector<duckdb::LogicalType,_true> *)&local_f0,&local_120,
             (scalar_function_t *)&stack0xfffffffffffffec0,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,in_stack_fffffffffffffeb8,bind_lambda);
  LogicalType::~LogicalType(&local_d8);
  ::std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffec0);
  LogicalType::~LogicalType(&local_120);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_f0);
  LogicalType::~LogicalType(&local_108);
  BaseScalarFunction::SetReturnsError(&local_c0,&in_RDI->super_BaseScalarFunction);
  BaseScalarFunction::~BaseScalarFunction(&local_c0);
  return in_RDI;
}

Assistant:

ScalarFunction FactorialOperatorFun::GetFunction() {
	ScalarFunction function({LogicalType::INTEGER}, LogicalType::HUGEINT,
	                        ScalarFunction::UnaryFunction<int32_t, hugeint_t, FactorialOperator>);
	BaseScalarFunction::SetReturnsError(function);
	return function;
}